

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fiowfda(osfildef *fp,vocddef *p,uint cnt)

{
  size_t sVar1;
  uint in_EDX;
  ushort *in_RSI;
  FILE *in_RDI;
  uint i;
  uchar buf [14];
  uint local_30;
  undefined1 local_2a [2];
  undefined1 local_28 [2];
  undefined1 local_26;
  undefined1 auStack_25 [4];
  undefined1 auStack_21 [2];
  undefined1 auStack_1f [3];
  uint local_1c;
  ushort *local_18;
  FILE *local_10;
  
  local_30 = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (local_1c <= local_30) {
      oswp2(local_2a,0xffff);
      sVar1 = fwrite(local_2a,0xd,1,local_10);
      return (uint)(sVar1 != 1);
    }
    if (*local_18 != 0xffff) {
      oswp2(local_2a,local_30);
      oswp2(local_28,(uint)*local_18);
      local_26 = (undefined1)local_18[4];
      switch(local_26) {
      case 1:
        oswp4s(auStack_25,*(long *)(local_18 + 8));
        break;
      case 2:
      case 10:
        oswp2(auStack_25,(uint)local_18[8]);
        break;
      case 0xd:
        oswp2(auStack_25,(uint)local_18[8]);
      }
      oswp2(auStack_21,(uint)local_18[0xc]);
      oswp2(auStack_1f,*(uint *)(local_18 + 0xe));
      sVar1 = fwrite(local_2a,0xd,1,local_10);
      if (sVar1 != 1) {
        return 1;
      }
    }
    local_30 = local_30 + 1;
    local_18 = local_18 + 0x10;
  } while( true );
}

Assistant:

static int fiowfda(osfildef *fp, vocddef *p, uint cnt)
{
    uchar buf[14];
    uint  i;
    
    for (i = 0 ; i < cnt ; ++i, ++p)
    {
        if (p->vocdfn == MCMONINV) continue;            /* not set - ignore */
        
        oswp2(buf, i);                        /* element in array to be set */
        oswp2(buf+2, p->vocdfn);       /* object number for function/target */
        buf[4] = p->vocdarg.runstyp;                    /* type of argument */
        switch(buf[4])
        {
        case DAT_NUMBER:
            oswp4s(buf+5, p->vocdarg.runsv.runsvnum);
            break;
        case DAT_OBJECT:
        case DAT_FNADDR:
            oswp2(buf+5, p->vocdarg.runsv.runsvobj);
            break;
        case DAT_PROPNUM:
            oswp2(buf+5, p->vocdarg.runsv.runsvprp);
            break;
        }
        oswp2(buf+9, p->vocdprp);
        oswp2(buf+11, p->vocdtim);
        
        /* write this record to file */
        if (osfwb(fp, buf, 13)) return(TRUE);
    }
    
    /* write end record - -1 for array element number */
    oswp2(buf, 0xffff);
    return(osfwb(fp, buf, 13));
}